

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O0

int omp_target_associate_ptr
              (void *host_ptr,void *device_ptr,size_t size,size_t device_offset,int device_num)

{
  bool bVar1;
  int iVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int rc;
  void *device_addr;
  DeviceTy *Device;
  undefined4 in_stack_00000018;
  int in_stack_ffffffffffffffc0;
  int local_4;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_4 = -1;
  }
  else {
    iVar2 = omp_get_initial_device();
    if (in_R8D == iVar2) {
      local_4 = -1;
    }
    else {
      bVar1 = device_is_ready(in_stack_ffffffffffffffc0);
      if (bVar1) {
        std::vector<DeviceTy,_std::allocator<DeviceTy>_>::operator[](&Devices,(long)in_R8D);
        local_4 = DeviceTy::associatePtr
                            ((DeviceTy *)size,(void *)device_offset,
                             (void *)CONCAT44(device_num,in_stack_00000018),(int64_t)Device);
      }
      else {
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

EXTERN int omp_target_associate_ptr(void *host_ptr, void *device_ptr,
    size_t size, size_t device_offset, int device_num) {
  DP("Call to omp_target_associate_ptr with host_ptr " DPxMOD ", "
      "device_ptr " DPxMOD ", size %zu, device_offset %zu, device_num %d\n",
      DPxPTR(host_ptr), DPxPTR(device_ptr), size, device_offset, device_num);

  if (!host_ptr || !device_ptr || size <= 0) {
    DP("Call to omp_target_associate_ptr with invalid arguments\n");
    return OFFLOAD_FAIL;
  }

  if (device_num == omp_get_initial_device()) {
    DP("omp_target_associate_ptr: no association possible on the host\n");
    return OFFLOAD_FAIL;
  }

  if (!device_is_ready(device_num)) {
    DP("omp_target_associate_ptr returns OFFLOAD_FAIL\n");
    return OFFLOAD_FAIL;
  }

  DeviceTy& Device = Devices[device_num];
  void *device_addr = (void *)((uint64_t)device_ptr + (uint64_t)device_offset);
  int rc = Device.associatePtr(host_ptr, device_addr, size);
  DP("omp_target_associate_ptr returns %d\n", rc);
  return rc;
}